

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall leveldb::log::_Test_OpenForAppend::_Run(_Test_OpenForAppend *this)

{
  undefined1 local_5b0 [448];
  undefined1 local_3f0 [448];
  undefined1 local_230 [455];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  _Test_OpenForAppend *local_10;
  _Test_OpenForAppend *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"hello",&local_31);
  LogTest::Write(&this->super_LogTest,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  LogTest::ReopenForAppend(&this->super_LogTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"world",&local_69);
  LogTest::Write(&this->super_LogTest,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  test::Tester::Tester
            ((Tester *)(local_230 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x15a);
  LogTest::Read_abi_cxx11_((LogTest *)local_230);
  test::Tester::IsEq<char[6],std::__cxx11::string>
            ((Tester *)(local_230 + 0x20),(char (*) [6])"hello",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
  std::__cxx11::string::~string((string *)local_230);
  test::Tester::~Tester((Tester *)(local_230 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_3f0 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x15b);
  LogTest::Read_abi_cxx11_((LogTest *)local_3f0);
  test::Tester::IsEq<char[6],std::__cxx11::string>
            ((Tester *)(local_3f0 + 0x20),(char (*) [6])"world",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
  std::__cxx11::string::~string((string *)local_3f0);
  test::Tester::~Tester((Tester *)(local_3f0 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_5b0 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x15c);
  LogTest::Read_abi_cxx11_((LogTest *)local_5b0);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)(local_5b0 + 0x20),(char (*) [4])"EOF",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0);
  std::__cxx11::string::~string((string *)local_5b0);
  test::Tester::~Tester((Tester *)(local_5b0 + 0x20));
  return;
}

Assistant:

TEST(LogTest, OpenForAppend) {
  Write("hello");
  ReopenForAppend();
  Write("world");
  ASSERT_EQ("hello", Read());
  ASSERT_EQ("world", Read());
  ASSERT_EQ("EOF", Read());
}